

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_structs.c
# Opt level: O3

ulp_ring_ciphertext * ulp_ring_alloc_ciphertext(size_t n)

{
  ulp_ring_ciphertext *__ptr;
  uint64_t *__ptr_00;
  uint64_t *__ptr_01;
  
  __ptr = (ulp_ring_ciphertext *)malloc(0x18);
  if (__ptr != (ulp_ring_ciphertext *)0x0) {
    __ptr->n = n;
    __ptr_00 = (uint64_t *)malloc(n << 3);
    __ptr->c1 = __ptr_00;
    __ptr_01 = (uint64_t *)malloc(n << 3);
    __ptr->c2 = __ptr_01;
    if (__ptr_00 != (uint64_t *)0x0 && __ptr_01 != (uint64_t *)0x0) {
      return __ptr;
    }
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr);
  }
  return (ulp_ring_ciphertext *)0x0;
}

Assistant:

ulp_ring_ciphertext* ulp_ring_alloc_ciphertext(size_t n) {
    ulp_ring_ciphertext* ciphertext = malloc(sizeof(ulp_ring_ciphertext));
    if(ciphertext == NULL)
        return NULL;
    ciphertext->n = n;
    ciphertext->c1 = malloc(n*sizeof(uint64_t));
    ciphertext->c2 = malloc(n*sizeof(uint64_t));
    if(ciphertext->c1 == NULL || ciphertext->c2 == NULL) {
        free(ciphertext->c1);
        free(ciphertext->c2);
        free(ciphertext);
        return NULL;
    }
    return ciphertext;
}